

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void CheckName(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  Bool BVar4;
  Node *pNVar5;
  ctmbstr s;
  byte *str;
  tchar c;
  uint local_2c;
  
  if ((attval == (AttVal *)0x0) || (str = (byte *)attval->value, str == (byte *)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0xfe);
    return;
  }
  if ((((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
      (uVar2 = node->tag->id - TidyTag_A, uVar2 < 0x40)) &&
     ((0x800a003000000021U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
    if (*(int *)((doc->config).value + 0x19) != 0) {
      do {
        bVar1 = *str;
        if (bVar1 == 0) goto LAB_001285c2;
        local_2c = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar3 = prvTidyGetUTF8((ctmbstr)str,&local_2c);
          str = str + uVar3;
        }
        str = str + 1;
        BVar4 = prvTidyIsXMLNamechar(local_2c);
      } while (BVar4 != no);
      prvTidyReportAttrError(doc,node,attval,0xff);
    }
LAB_001285c2:
    pNVar5 = GetNodeByAnchor(doc,attval->value);
    if (pNVar5 == node || pNVar5 == (Node *)0x0) {
      AddAnchor(doc,attval->value,node);
    }
    else {
      prvTidyReportAttrError(doc,node,attval,0x10e);
    }
  }
  return;
}

Assistant:

void CheckName( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    Node *old;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    if ( TY_(IsAnchorElement)(doc, node) )
    {
        if (cfgBool(doc, TidyXmlOut) && !IsValidNMTOKEN(attval->value))
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);

        if ((old = GetNodeByAnchor(doc, attval->value)) &&  old != node)
        {
            TY_(ReportAttrError)( doc, node, attval, ANCHOR_NOT_UNIQUE);
        }
        else
            AddAnchor( doc, attval->value, node );
    }
}